

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O2

Scalar * __thiscall
Eigen::SparseMatrix<double,_0,_int>::insertUncompressed
          (SparseMatrix<double,_0,_int> *this,Index row,Index col)

{
  StorageIndex *pSVar1;
  int iVar2;
  Scalar *pSVar3;
  StorageIndex *pSVar4;
  int iVar5;
  long lVar6;
  SingletonVector local_20;
  
  pSVar4 = this->m_innerNonZeros;
  iVar5 = this->m_outerIndex[col];
  iVar2 = pSVar4[col];
  if (this->m_outerIndex[col + 1] - iVar5 <= iVar2) {
    local_20.m_value = 2;
    if (2 < iVar2) {
      local_20.m_value = iVar2;
    }
    local_20.m_index = (StorageIndex)col;
    SparseMatrix<double,0,int>::
    reserveInnerVectors<Eigen::SparseMatrix<double,0,int>::SingletonVector>
              ((SparseMatrix<double,0,int> *)this,&local_20);
    pSVar4 = this->m_innerNonZeros;
    iVar5 = this->m_outerIndex[col];
    iVar2 = pSVar4[col];
  }
  lVar6 = (long)iVar2 + (long)iVar5;
  pSVar1 = (this->m_data).m_indices;
  pSVar3 = (this->m_data).m_values + lVar6;
  for (; (iVar5 < lVar6 && ((int)row < pSVar1[lVar6 + -1])); lVar6 = lVar6 + -1) {
    pSVar1[lVar6] = pSVar1[lVar6 + -1];
    *pSVar3 = pSVar3[-1];
    pSVar3 = pSVar3 + -1;
  }
  pSVar4[col] = pSVar4[col] + 1;
  pSVar1[lVar6] = (int)row;
  *pSVar3 = 0.0;
  return pSVar3;
}

Assistant:

EIGEN_DONT_INLINE typename SparseMatrix<_Scalar,_Options,_StorageIndex>::Scalar& SparseMatrix<_Scalar,_Options,_StorageIndex>::insertUncompressed(Index row, Index col)
{
  eigen_assert(!isCompressed());

  const Index outer = IsRowMajor ? row : col;
  const StorageIndex inner = convert_index(IsRowMajor ? col : row);

  Index room = m_outerIndex[outer+1] - m_outerIndex[outer];
  StorageIndex innerNNZ = m_innerNonZeros[outer];
  if(innerNNZ>=room)
  {
    // this inner vector is full, we need to reallocate the whole buffer :(
    reserve(SingletonVector(outer,std::max<StorageIndex>(2,innerNNZ)));
  }

  Index startId = m_outerIndex[outer];
  Index p = startId + m_innerNonZeros[outer];
  while ( (p > startId) && (m_data.index(p-1) > inner) )
  {
    m_data.index(p) = m_data.index(p-1);
    m_data.value(p) = m_data.value(p-1);
    --p;
  }
  eigen_assert((p<=startId || m_data.index(p-1)!=inner) && "you cannot insert an element that already exists, you must call coeffRef to this end");

  m_innerNonZeros[outer]++;

  m_data.index(p) = inner;
  return (m_data.value(p) = Scalar(0));
}